

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl2.cpp
# Opt level: O0

void ImGui_ImplOpenGL2_SetupRenderState(ImDrawData *draw_data,int fb_width,int fb_height)

{
  GLsizei in_EDX;
  GLsizei in_ESI;
  long in_RDI;
  
  (*glad_glEnable)(0xbe2);
  (*glad_glBlendFunc)(0x302,0x303);
  (*glad_glDisable)(0xb44);
  (*glad_glDisable)(0xb71);
  (*glad_glDisable)(0xb90);
  (*glad_glDisable)(0xb50);
  (*glad_glDisable)(0xb57);
  (*glad_glEnable)(0xc11);
  (*glad_glEnableClientState)(0x8074);
  (*glad_glEnableClientState)(0x8078);
  (*glad_glEnableClientState)(0x8076);
  (*glad_glDisableClientState)(0x8075);
  (*glad_glEnable)(0xde1);
  (*glad_glPolygonMode)(0x408,0x1b02);
  (*glad_glShadeModel)(0x1d01);
  (*glad_glTexEnvi)(0x2300,0x2200,0x2100);
  (*glad_glViewport)(0,0,in_ESI,in_EDX);
  (*glad_glMatrixMode)(0x1701);
  (*glad_glPushMatrix)();
  (*glad_glLoadIdentity)();
  (*glad_glOrtho)((double)*(float *)(in_RDI + 0x20),
                  (double)(*(float *)(in_RDI + 0x20) + *(float *)(in_RDI + 0x28)),
                  (double)(*(float *)(in_RDI + 0x24) + *(float *)(in_RDI + 0x2c)),
                  (double)*(float *)(in_RDI + 0x24),-1.0,1.0);
  (*glad_glMatrixMode)(0x1700);
  (*glad_glPushMatrix)();
  (*glad_glLoadIdentity)();
  return;
}

Assistant:

static void ImGui_ImplOpenGL2_SetupRenderState(ImDrawData* draw_data, int fb_width, int fb_height)
{
    // Setup render state: alpha-blending enabled, no face culling, no depth testing, scissor enabled, vertex/texcoord/color pointers, polygon fill.
    glEnable(GL_BLEND);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
    //glBlendFuncSeparate(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ONE, GL_ONE_MINUS_SRC_ALPHA); // In order to composite our output buffer we need to preserve alpha
    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
    glDisable(GL_STENCIL_TEST);
    glDisable(GL_LIGHTING);
    glDisable(GL_COLOR_MATERIAL);
    glEnable(GL_SCISSOR_TEST);
    glEnableClientState(GL_VERTEX_ARRAY);
    glEnableClientState(GL_TEXTURE_COORD_ARRAY);
    glEnableClientState(GL_COLOR_ARRAY);
    glDisableClientState(GL_NORMAL_ARRAY);
    glEnable(GL_TEXTURE_2D);
    glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
    glShadeModel(GL_SMOOTH);
    glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_MODULATE);

    // If you are using this code with non-legacy OpenGL header/contexts (which you should not, prefer using imgui_impl_opengl3.cpp!!),
    // you may need to backup/reset/restore other state, e.g. for current shader using the commented lines below.
    // (DO NOT MODIFY THIS FILE! Add the code in your calling function)
    //   GLint last_program;
    //   glGetIntegerv(GL_CURRENT_PROGRAM, &last_program);
    //   glUseProgram(0);
    //   ImGui_ImplOpenGL2_RenderDrawData(...);
    //   glUseProgram(last_program)
    // There are potentially many more states you could need to clear/setup that we can't access from default headers.
    // e.g. glBindBuffer(GL_ARRAY_BUFFER, 0), glDisable(GL_TEXTURE_CUBE_MAP).

    // Setup viewport, orthographic projection matrix
    // Our visible imgui space lies from draw_data->DisplayPos (top left) to draw_data->DisplayPos+data_data->DisplaySize (bottom right). DisplayPos is (0,0) for single viewport apps.
    glViewport(0, 0, (GLsizei)fb_width, (GLsizei)fb_height);
    glMatrixMode(GL_PROJECTION);
    glPushMatrix();
    glLoadIdentity();
    glOrtho(draw_data->DisplayPos.x, draw_data->DisplayPos.x + draw_data->DisplaySize.x, draw_data->DisplayPos.y + draw_data->DisplaySize.y, draw_data->DisplayPos.y, -1.0f, +1.0f);
    glMatrixMode(GL_MODELVIEW);
    glPushMatrix();
    glLoadIdentity();
}